

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O3

int __thiscall sockpp::connector::connect(connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  char cVar1;
  int iVar2;
  socklen_t __len_00;
  int iVar3;
  sockaddr *__addr_00;
  long *plVar4;
  int *piVar5;
  long *plVar6;
  long *plVar7;
  int in_register_0000000c;
  undefined4 in_register_00000034;
  socket *this_00;
  int err;
  pollfd fds;
  socklen_t len;
  int local_7c;
  int local_78 [2];
  long *local_70;
  undefined1 local_68 [24];
  int *local_50;
  pollfd local_48;
  long *local_40;
  socklen_t local_34;
  
  this_00 = (socket *)CONCAT44(in_register_00000034,__fd);
  if (CONCAT44(in_register_0000000c,__len) == 0 || in_register_0000000c < 0) {
    connect(this,__fd,__addr,__len);
    goto LAB_00106d49;
  }
  recreate((result<sockpp::none> *)this,(connector *)this_00,(sock_address *)__addr);
  if (*(int *)(this + 8) != 0) goto LAB_00106d49;
  iVar2 = (*this_00->_vptr_socket[4])(this_00);
  if ((char)iVar2 == '\0') {
    (*this_00->_vptr_socket[3])(local_68,this_00,1);
  }
  iVar3 = this_00->handle_;
  __addr_00 = (sockaddr *)(**(code **)(*(long *)__addr + 0x20))(__addr);
  __len_00 = (**(code **)(*(long *)__addr + 0x10))(__addr);
  iVar3 = ::connect(iVar3,__addr_00,__len_00);
  if (iVar3 < 0) {
    piVar5 = __errno_location();
    iVar3 = *piVar5;
    plVar6 = (long *)std::_V2::system_category();
    plVar4 = plVar6;
    if (iVar3 == 0) goto LAB_00106d17;
    local_78[0] = iVar3;
    local_70 = plVar6;
    local_50 = piVar5;
    plVar7 = (long *)std::_V2::generic_category();
    local_68._0_4_ = 0x73;
    local_68._8_8_ = plVar7;
    cVar1 = (**(code **)(*plVar6 + 0x30))(plVar6,iVar3);
    if ((cVar1 == '\0') &&
       (cVar1 = (**(code **)(*(long *)local_68._8_8_ + 0x38))
                          (local_68._8_8_,local_78,local_68._0_4_), cVar1 == '\0')) {
      local_48.fd = 0xb;
      local_40 = plVar7;
      cVar1 = (**(code **)(*local_70 + 0x30))(local_70,local_78[0]);
      if ((cVar1 != '\0') ||
         (cVar1 = (**(code **)(*local_40 + 0x38))(local_40,local_78,local_48.fd), cVar1 != '\0'))
      goto LAB_00106dff;
    }
    else {
LAB_00106dff:
      local_48.fd = this_00->handle_;
      local_48.events = 5;
      local_48.revents = 0;
      iVar3 = poll(&local_48,1,(int)(CONCAT44(in_register_0000000c,__len) / 1000));
      if (iVar3 < 0) {
        plVar4 = plVar7;
        iVar3 = 0x6e;
        if (*local_50 != 0) {
          plVar4 = plVar6;
          iVar3 = *local_50;
        }
      }
      else if (iVar3 == 0) {
        plVar4 = plVar7;
        iVar3 = 0x6e;
      }
      else {
        local_34 = 4;
        socket::get_option((result<sockpp::none> *)local_68,this_00,1,4,&local_7c,&local_34);
        if ((local_68._8_4_ != 0) || (iVar3 = local_7c, local_7c == 0)) goto LAB_00106d17;
      }
    }
    (*this_00->_vptr_socket[5])(local_68,this_00);
    *(int *)(this + 8) = iVar3;
  }
  else {
    plVar4 = (long *)std::_V2::system_category();
LAB_00106d17:
    if ((char)iVar2 == '\0') {
      (*this_00->_vptr_socket[3])(local_68,this_00,0);
    }
    *(undefined4 *)(this + 8) = 0;
  }
  *(long **)(this + 0x10) = plVar4;
LAB_00106d49:
  return (int)this;
}

Assistant:

result<> connector::connect(const sock_address& addr, microseconds timeout) {
    if (timeout.count() <= 0)
        return connect(addr);

    if (auto res = recreate(addr); !res)
        return res;

    bool non_blocking =
#if defined(_WIN32)
        false;
#else
        is_non_blocking();
#endif

    if (!non_blocking)
        set_non_blocking(true);

    auto res = check_res(::connect(handle(), addr.sockaddr_ptr(), addr.size()));

    if (!res) {
        auto err = res.error();
        if (err == errc::operation_in_progress || err == errc::operation_would_block) {
// TODO: Windows has a WSAPoll() function we can use.
#if defined(_WIN32)
            // Non-blocking connect -- call `select` to wait until the timeout:
            // Note:  Windows returns errors in exceptset so check it too, the
            // logic afterwords doesn't change
            fd_set readset;
            FD_ZERO(&readset);
            FD_SET(handle(), &readset);
            fd_set writeset = readset;
            fd_set exceptset = readset;
            timeval tv = to_timeval(timeout);
            res =
                check_res(::select(int(handle()) + 1, &readset, &writeset, &exceptset, &tv));
#else
            pollfd fds = {handle(), POLLIN | POLLOUT, 0};
            int ms = int(duration_cast<milliseconds>(timeout).count());
            res = check_res(::poll(&fds, 1, ms));
#endif
            if (res) {
                if (res && res.value() > 0) {
                    // Got a socket event, but it might be an error, so check:
                    int err;
                    if (get_option(SOL_SOCKET, SO_ERROR, &err))
                        res = result<int>::from_error(err);
                }
                else {
                    res = errc::timed_out;
                }
            }
        }

        if (!res) {
            close();
            return res.error();
        }
    }

    // Restore blocking mode for socket, if needed.
    if (!non_blocking)
        set_non_blocking(false);

    return none{};
}